

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GetStackTrace
          (GraphCycles *this,GraphId id,void ***ptr)

{
  Node *pNVar1;
  Node *n;
  void ***ptr_local;
  GraphCycles *this_local;
  GraphId id_local;
  
  pNVar1 = FindNode(this->rep_,id);
  if (pNVar1 == (Node *)0x0) {
    *ptr = (void **)0x0;
    id_local.handle._4_4_ = 0;
  }
  else {
    *ptr = pNVar1->stack;
    id_local.handle._4_4_ = pNVar1->nstack;
  }
  return id_local.handle._4_4_;
}

Assistant:

int GraphCycles::GetStackTrace(GraphId id, void*** ptr) {
  Node* n = FindNode(rep_, id);
  if (n == nullptr) {
    *ptr = nullptr;
    return 0;
  } else {
    *ptr = n->stack;
    return n->nstack;
  }
}